

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O1

vec3 __thiscall ggx::sample(ggx *this,vec3 *view_dir,vec2 *random_parameters)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  
  fVar3 = (random_parameters->field_0).field_0.y;
  fVar4 = (random_parameters->field_0).field_0.x * 6.2831855;
  fVar5 = this->_alpha;
  fVar3 = fVar3 / (1.0 - fVar3);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar5 = fVar5 * fVar3;
  fVar3 = cosf(fVar4);
  fVar3 = fVar3 * fVar5;
  fVar4 = sinf(fVar4);
  fVar4 = fVar4 * fVar5;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + 1.0;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  fVar1 = (view_dir->field_0).field_0.x;
  fVar6 = -(view_dir->field_0).field_0.y;
  fVar2 = (view_dir->field_0).field_0.z;
  fVar7 = (fVar4 * fVar5 * fVar6 - fVar1 * fVar3 * fVar5) - fVar2 * fVar5;
  fVar3 = fVar3 * fVar5 * fVar7;
  fVar4 = fVar4 * fVar5 * fVar7;
  vVar8.field_0._0_4_ = -fVar1 - (fVar3 + fVar3);
  vVar8.field_0.field_0.y = fVar6 - (fVar4 + fVar4);
  vVar8.field_0._8_4_ = -fVar2 - (fVar7 * fVar5 + fVar7 * fVar5);
  return (vec3)vVar8.field_0;
}

Assistant:

glm::vec3 ggx::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  float u1 = random_parameters.x;
  float u2 = random_parameters.y;

  // This is classic GGX sampling, it is rewritten to solve for X-axis side of right triangle. For simplicity,
  // we assume that other side is equal to 1. Hypotenuse is equal to sqrt(r^2+1). In that case:
  //   cos(theta) = (1) / sqrt(r^2+1)
  // Now we can transform standard GGX sampling method by comparing that cos(theta) and cos(theta) defined by
  // sampling method. In the end we get:
  //   r = alpha * sqrt(u/(1-u))

  const float phi = 2.0f * pi * u1;
  const float r = _alpha * sqrtf(u2/(1.0f - u2));

  const glm::vec3 h = glm::normalize(glm::vec3(r*cosf(phi), r*sinf(phi), 1.0f));
  const glm::vec3 l = glm::reflect(-view_dir, h);

  return l;
}